

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_export(mbedtls_ecp_keypair *key,mbedtls_ecp_group *grp,mbedtls_mpi *d,
                      mbedtls_ecp_point *Q)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_group_load(grp,(key->grp).id);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_copy(d,&key->d);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_copy(Q,&key->Q);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_export(const mbedtls_ecp_keypair *key, mbedtls_ecp_group *grp,
                       mbedtls_mpi *d, mbedtls_ecp_point *Q)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_ecp_group_copy(grp, &key->grp)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_mpi_copy(d, &key->d)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ecp_copy(Q, &key->Q)) != 0) {
        return ret;
    }

    return 0;
}